

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

GreaterEqualLayerParams * __thiscall
CoreML::Specification::GreaterEqualLayerParams::New(GreaterEqualLayerParams *this,Arena *arena)

{
  GreaterEqualLayerParams *this_00;
  GreaterEqualLayerParams *n;
  Arena *arena_local;
  GreaterEqualLayerParams *this_local;
  
  this_00 = (GreaterEqualLayerParams *)operator_new(0x18);
  GreaterEqualLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GreaterEqualLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GreaterEqualLayerParams* GreaterEqualLayerParams::New(::google::protobuf::Arena* arena) const {
  GreaterEqualLayerParams* n = new GreaterEqualLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}